

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_vec_simd_sqshrn
               (DisasContext_conflict1 *s,_Bool is_scalar,_Bool is_q,_Bool is_u_shift,
               _Bool is_u_narrow,int immh,int immb,int opcode,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint len;
  int shift_00;
  uint32_t uVar4;
  uint32_t uVar5;
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  TCGv_i32 arg_01;
  TCGv_i64 tcg_src;
  MemOp MVar6;
  int local_84;
  uint64_t round_const;
  NeonGenNarrowEnvFn *pNStack_70;
  int i;
  NeonGenNarrowEnvFn *narrowfn;
  TCGv_i64 tcg_final;
  TCGv_i32 tcg_rd_narrowed;
  TCGv_i64 tcg_round;
  TCGv_i64 tcg_rd;
  TCGv_i64 tcg_rn;
  MemOp ldop;
  _Bool round;
  int elements;
  int shift;
  int esize;
  int size;
  int immhb;
  TCGContext_conflict1 *tcg_ctx;
  int immh_local;
  _Bool is_u_narrow_local;
  _Bool is_u_shift_local;
  _Bool is_q_local;
  _Bool is_scalar_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar2 = clz32(immh);
  iVar2 = -iVar2;
  iVar3 = iVar2 + 0x1f;
  len = 8 << ((byte)iVar3 & 0x1f);
  shift_00 = len * 2 - (immh << 3 | immb);
  if (is_scalar) {
    local_84 = 1;
  }
  else {
    local_84 = (int)(0x40 / (long)(int)len);
  }
  uVar4 = extract32(opcode,0,1);
  MVar6 = MO_ASHIFT;
  if (is_u_shift) {
    MVar6 = MO_8;
  }
  if (iVar3 < 4) {
    uVar5 = extract32(immh,3,1);
    if (uVar5 == 0) {
      _Var1 = fp_access_check(s);
      if (_Var1) {
        if (is_u_shift) {
          pNStack_70 = handle_vec_simd_sqshrn::unsigned_narrow_fns[iVar3];
        }
        else {
          pNStack_70 = handle_vec_simd_sqshrn::signed_narrow_fns[iVar3][(int)(uint)is_u_narrow];
        }
        arg = tcg_temp_new_i64(tcg_ctx_00);
        arg_00 = tcg_temp_new_i64(tcg_ctx_00);
        arg_01 = tcg_temp_new_i32(tcg_ctx_00);
        tcg_src = tcg_const_i64_aarch64(tcg_ctx_00,0);
        if (uVar4 != 0) {
          tcg_rd_narrowed =
               (TCGv_i32)tcg_const_i64_aarch64(tcg_ctx_00,1L << ((char)shift_00 - 1U & 0x3f));
        }
        else {
          tcg_rd_narrowed = (TCGv_i32)0x0;
        }
        for (round_const._4_4_ = 0; round_const._4_4_ < local_84;
            round_const._4_4_ = round_const._4_4_ + 1) {
          read_vec_element(s,arg,rn,round_const._4_4_,iVar2 + MO_ALIGN_4 | MVar6);
          handle_shri_with_rndacc
                    (tcg_ctx_00,arg_00,arg,(TCGv_i64)tcg_rd_narrowed,false,is_u_shift,iVar2 + 0x20,
                     shift_00);
          (*pNStack_70)(tcg_ctx_00,arg_01,tcg_ctx_00->cpu_env,arg_00);
          tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,arg_00,arg_01);
          tcg_gen_deposit_i64_aarch64(tcg_ctx_00,tcg_src,tcg_src,arg_00,len * round_const._4_4_,len)
          ;
        }
        if (is_q) {
          write_vec_element(s,tcg_src,rd,1,MO_64);
        }
        else {
          write_vec_element(s,tcg_src,rd,0,MO_64);
        }
        if (uVar4 != 0) {
          tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)tcg_rd_narrowed);
        }
        tcg_temp_free_i64(tcg_ctx_00,arg);
        tcg_temp_free_i64(tcg_ctx_00,arg_00);
        tcg_temp_free_i32(tcg_ctx_00,arg_01);
        tcg_temp_free_i64(tcg_ctx_00,tcg_src);
        clear_vec_high(s,is_q,rd);
      }
    }
    else {
      unallocated_encoding_aarch64(s);
    }
    return;
  }
  __assert_fail("size < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x20ff,
                "void handle_vec_simd_sqshrn(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int, int)"
               );
}

Assistant:

static void handle_vec_simd_sqshrn(DisasContext *s, bool is_scalar, bool is_q,
                                   bool is_u_shift, bool is_u_narrow,
                                   int immh, int immb, int opcode,
                                   int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int esize = 8 << size;
    int shift = (2 * esize) - immhb;
    int elements = is_scalar ? 1 : (64 / esize);
    bool round = extract32(opcode, 0, 1);
    MemOp ldop = (size + 1) | (is_u_shift ? 0 : MO_SIGN);
    TCGv_i64 tcg_rn, tcg_rd, tcg_round;
    TCGv_i32 tcg_rd_narrowed;
    TCGv_i64 tcg_final;

    static NeonGenNarrowEnvFn * const signed_narrow_fns[4][2] = {
        { gen_helper_neon_narrow_sat_s8,
          gen_helper_neon_unarrow_sat8 },
        { gen_helper_neon_narrow_sat_s16,
          gen_helper_neon_unarrow_sat16 },
        { gen_helper_neon_narrow_sat_s32,
          gen_helper_neon_unarrow_sat32 },
        { NULL, NULL },
    };
    static NeonGenNarrowEnvFn * const unsigned_narrow_fns[4] = {
        gen_helper_neon_narrow_sat_u8,
        gen_helper_neon_narrow_sat_u16,
        gen_helper_neon_narrow_sat_u32,
        NULL
    };
    NeonGenNarrowEnvFn *narrowfn;

    int i;

    assert(size < 4);

    if (extract32(immh, 3, 1)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_u_shift) {
        narrowfn = unsigned_narrow_fns[size];
    } else {
        narrowfn = signed_narrow_fns[size][is_u_narrow ? 1 : 0];
    }

    tcg_rn = tcg_temp_new_i64(tcg_ctx);
    tcg_rd = tcg_temp_new_i64(tcg_ctx);
    tcg_rd_narrowed = tcg_temp_new_i32(tcg_ctx);
    tcg_final = tcg_const_i64(tcg_ctx, 0);

    if (round) {
        uint64_t round_const = 1ULL << (shift - 1);
        tcg_round = tcg_const_i64(tcg_ctx, round_const);
    } else {
        tcg_round = NULL;
    }

    for (i = 0; i < elements; i++) {
        read_vec_element(s, tcg_rn, rn, i, ldop);
        handle_shri_with_rndacc(tcg_ctx, tcg_rd, tcg_rn, tcg_round,
                                false, is_u_shift, size+1, shift);
        narrowfn(tcg_ctx, tcg_rd_narrowed, tcg_ctx->cpu_env, tcg_rd);
        tcg_gen_extu_i32_i64(tcg_ctx, tcg_rd, tcg_rd_narrowed);
        tcg_gen_deposit_i64(tcg_ctx, tcg_final, tcg_final, tcg_rd, esize * i, esize);
    }

    if (!is_q) {
        write_vec_element(s, tcg_final, rd, 0, MO_64);
    } else {
        write_vec_element(s, tcg_final, rd, 1, MO_64);
    }

    if (round) {
        tcg_temp_free_i64(tcg_ctx, tcg_round);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_rn);
    tcg_temp_free_i64(tcg_ctx, tcg_rd);
    tcg_temp_free_i32(tcg_ctx, tcg_rd_narrowed);
    tcg_temp_free_i64(tcg_ctx, tcg_final);

    clear_vec_high(s, is_q, rd);
}